

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

float ImGui::ScaleValueFromRatioT<float,float,float>
                (ImGuiDataType data_type,float t,float v_min,float v_max,bool is_logarithmic,
                float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  bool bVar13;
  int iVar14;
  undefined1 auVar17 [16];
  int iVar15;
  undefined1 auVar18 [16];
  float fVar16;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar24 [64];
  undefined1 in_register_00001284 [60];
  undefined1 auVar25 [64];
  undefined1 in_register_000012c4 [12];
  undefined1 auVar26 [16];
  float fVar27;
  int iVar28;
  undefined1 local_18 [16];
  undefined1 extraout_var [60];
  
  auVar25._4_60_ = in_register_00001284;
  auVar25._0_4_ = v_max;
  auVar24._4_60_ = in_register_00001244;
  auVar24._0_4_ = v_min;
  auVar22._4_60_ = in_register_00001204;
  auVar22._0_4_ = t;
  auVar20 = auVar24._0_16_;
  if ((v_min == v_max) && (!NAN(v_min) && !NAN(v_max))) {
    return v_min;
  }
  auVar19 = auVar25._0_16_;
  if (!is_logarithmic) {
    if ((data_type & 0xfffffffeU) == 8) {
      auVar20 = vfmadd213ss_fma(auVar22._0_16_,ZEXT416((uint)(v_max - v_min)),auVar20);
      return auVar20._0_4_;
    }
    if (1.0 <= t) {
      return v_max;
    }
    uVar4 = vcmpss_avx512f(auVar19,auVar20,1);
    bVar5 = (bool)((byte)uVar4 & 1);
    return t * (v_max - v_min) + (float)((uint)bVar5 * -0x41000000 + (uint)!bVar5 * 0x3f000000) +
           v_min;
  }
  auVar21._0_12_ = ZEXT412(0);
  auVar21._12_4_ = 0;
  if (t <= 0.0) {
    return v_min;
  }
  if (1.0 <= t) {
    return v_max;
  }
  auVar26._8_4_ = 0x7fffffff;
  auVar26._0_8_ = 0x7fffffff7fffffff;
  auVar26._12_4_ = 0x7fffffff;
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar3._4_12_ = in_register_000012c4;
  auVar3._0_4_ = logarithmic_zero_epsilon;
  auVar17 = vxorps_avx512vl(auVar3,auVar2);
  uVar4 = vcmpss_avx512f(auVar19,auVar21,0);
  bVar5 = (bool)((byte)uVar4 & 1);
  bVar12 = v_max < v_min;
  bVar13 = v_min < 0.0;
  auVar2 = vandps_avx(auVar20,auVar26);
  auVar3 = vandps_avx(auVar19,auVar26);
  auVar10._4_12_ = in_register_000012c4;
  auVar10._0_4_ = logarithmic_zero_epsilon;
  uVar4 = vcmpss_avx512f(auVar2,auVar10,1);
  bVar6 = (bool)((byte)uVar4 & 1);
  iVar28 = auVar17._0_4_;
  auVar18._4_12_ = in_register_00001244._0_12_;
  iVar14 = (uint)bVar6 * ((uint)bVar13 * iVar28 + (uint)!bVar13 * (int)logarithmic_zero_epsilon) +
           (uint)!bVar6 * (int)v_min;
  uVar4 = vcmpss_avx512f(auVar19,auVar21,1);
  bVar6 = (bool)((byte)uVar4 & 1);
  auVar17._4_12_ = in_register_000012c4;
  auVar17._0_4_ = logarithmic_zero_epsilon;
  uVar4 = vcmpss_avx512f(auVar3,auVar17,1);
  bVar7 = (bool)((byte)uVar4 & 1);
  local_18._4_12_ = in_register_00001284._0_12_;
  iVar15 = (uint)bVar7 * ((uint)bVar6 * iVar28 + (uint)!bVar6 * (int)logarithmic_zero_epsilon) +
           (uint)!bVar7 * (int)v_max;
  auVar18._0_4_ = (float)((uint)bVar12 * iVar15 + (uint)!bVar12 * iVar14);
  iVar14 = (uint)bVar12 * iVar14 + (uint)!bVar12 * iVar15;
  local_18._0_4_ =
       (uint)bVar13 * ((uint)bVar5 * iVar28 + (uint)!bVar5 * iVar14) + (uint)!bVar13 * iVar14;
  fVar16 = (float)((uint)bVar12 * (int)(1.0 - t) + (uint)!bVar12 * (int)t);
  if (0.0 <= v_min * v_max) {
    if ((v_min < 0.0) || (v_max < 0.0)) {
      fVar27 = auVar18._0_4_ / (float)local_18._0_4_;
      fVar16 = 1.0 - fVar16;
    }
    else {
      fVar27 = (float)local_18._0_4_ / auVar18._0_4_;
      local_18 = auVar18;
    }
  }
  else {
    auVar20 = vminss_avx(auVar20,auVar19);
    auVar19._8_4_ = 0x80000000;
    auVar19._0_8_ = 0x8000000080000000;
    auVar19._12_4_ = 0x80000000;
    auVar19 = vxorps_avx512vl(auVar20,auVar19);
    auVar20._8_4_ = 0x7fffffff;
    auVar20._0_8_ = 0x7fffffff7fffffff;
    auVar20._12_4_ = 0x7fffffff;
    auVar20 = vandps_avx512vl(ZEXT416((uint)(v_max - v_min)),auVar20);
    fVar27 = auVar19._0_4_ / auVar20._0_4_;
    fVar1 = fVar27 + zero_deadzone_halfsize;
    if ((fVar27 - zero_deadzone_halfsize <= fVar16) && (fVar16 <= fVar1)) {
      return 0.0;
    }
    auVar11._4_12_ = in_register_000012c4;
    auVar11._0_4_ = logarithmic_zero_epsilon;
    if (fVar16 < fVar27) {
      auVar8._8_4_ = 0x80000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar8._12_4_ = 0x80000000;
      auVar20 = vxorps_avx512vl(auVar18,auVar8);
      auVar23._0_4_ =
           powf(auVar20._0_4_ / logarithmic_zero_epsilon,
                1.0 - fVar16 / (fVar27 - zero_deadzone_halfsize));
      auVar23._4_60_ = extraout_var;
      auVar9._8_4_ = 0x80000000;
      auVar9._0_8_ = 0x8000000080000000;
      auVar9._12_4_ = 0x80000000;
      auVar20 = vxorps_avx512vl(auVar23._0_16_,auVar9);
      fVar16 = auVar20._0_4_;
      local_18._0_4_ = logarithmic_zero_epsilon;
      goto LAB_0029a2f3;
    }
    fVar27 = (float)local_18._0_4_ / logarithmic_zero_epsilon;
    fVar16 = (fVar16 - fVar1) / (1.0 - fVar1);
    local_18 = auVar11;
  }
  fVar16 = powf(fVar27,fVar16);
LAB_0029a2f3:
  return fVar16 * (float)local_18._0_4_;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return v_min;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_floating_point)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}